

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modes.c
# Opt level: O0

void cf_ctr_init(cf_ctr *ctx,cf_prp *prp,void *prpctx,uint8_t *nonce)

{
  uint8_t *nonce_local;
  void *prpctx_local;
  cf_prp *prp_local;
  cf_ctr *ctx_local;
  
  memset(ctx,0,0x48);
  ctx->counter_offset = 0;
  ctx->counter_width = prp->blocksz;
  ctx->prp = prp;
  ctx->prpctx = prpctx;
  ctx->nkeymat = 0;
  memcpy(ctx->nonce,nonce,prp->blocksz);
  return;
}

Assistant:

void cf_ctr_init(cf_ctr *ctx, const cf_prp *prp, void *prpctx, const uint8_t nonce[CF_MAXBLOCK])
{
  memset(ctx, 0, sizeof *ctx);
  ctx->counter_offset = 0;
  ctx->counter_width = prp->blocksz;
  ctx->prp = prp;
  ctx->prpctx = prpctx;
  ctx->nkeymat = 0;
  memcpy(ctx->nonce, nonce, prp->blocksz);
}